

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

Vec_Ptr_t * Abc_NodeFindCut(Abc_ManCut_t *p,Abc_Obj_t *pRoot,int fContain)

{
  uint *puVar1;
  int iVar2;
  void *Entry;
  Vec_Ptr_t *pVVar3;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                  ,0x105,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  if ((*(uint *)&pRoot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                  ,0x106,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  pVVar3 = p->vVisited;
  pVVar3->nSize = 0;
  Vec_PtrPush(pVVar3,pRoot);
  Vec_PtrPush(p->vVisited,pRoot->pNtk->vObjs->pArray[*(pRoot->vFanins).pArray]);
  Vec_PtrPush(p->vVisited,pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[1]]);
  pRoot->field_0x14 = pRoot->field_0x14 | 0x20;
  puVar1 = (uint *)((long)pRoot->pNtk->vObjs->pArray[*(pRoot->vFanins).pArray] + 0x14);
  *puVar1 = *puVar1 | 0x20;
  puVar1 = (uint *)((long)pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[1]] + 0x14);
  *puVar1 = *puVar1 | 0x20;
  pVVar3 = p->vNodeLeaves;
  pVVar3->nSize = 0;
  Vec_PtrPush(pVVar3,pRoot->pNtk->vObjs->pArray[*(pRoot->vFanins).pArray]);
  Vec_PtrPush(p->vNodeLeaves,pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[1]]);
  do {
    iVar2 = Abc_NodeBuildCutLevelOne_int(p->vVisited,p->vNodeLeaves,p->nNodeSizeMax,p->nNodeFanStop)
    ;
  } while (iVar2 != 0);
  pVVar3 = p->vNodeLeaves;
  if (p->nNodeSizeMax < pVVar3->nSize) {
    __assert_fail("Vec_PtrSize(p->vNodeLeaves) <= p->nNodeSizeMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                  ,0x118,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  if (fContain != 0) {
    if (p->nConeSizeMax <= p->nNodeSizeMax) {
      __assert_fail("p->nNodeSizeMax < p->nConeSizeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                    ,0x124,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
    }
    p->vConeLeaves->nSize = 0;
    for (iVar2 = 0; iVar2 < pVVar3->nSize; iVar2 = iVar2 + 1) {
      Entry = Vec_PtrEntry(pVVar3,iVar2);
      Vec_PtrPush(p->vConeLeaves,Entry);
      pVVar3 = p->vNodeLeaves;
    }
    do {
      iVar2 = Abc_NodeBuildCutLevelOne_int
                        (p->vVisited,p->vConeLeaves,p->nConeSizeMax,p->nConeFanStop);
    } while (iVar2 != 0);
    if (p->nConeSizeMax < p->vConeLeaves->nSize) {
      __assert_fail("Vec_PtrSize(p->vConeLeaves) <= p->nConeSizeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                    ,299,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
    }
  }
  Abc_NodesUnmarkB(p->vVisited);
  return p->vNodeLeaves;
}

Assistant:

Vec_Ptr_t * Abc_NodeFindCut( Abc_ManCut_t * p, Abc_Obj_t * pRoot, int fContain )
{
    Abc_Obj_t * pNode;
    int i;

    assert( !Abc_ObjIsComplement(pRoot) );
    assert( Abc_ObjIsNode(pRoot) );

    // start the visited nodes and mark them
    Vec_PtrClear( p->vVisited );
    Vec_PtrPush( p->vVisited, pRoot );
    Vec_PtrPush( p->vVisited, Abc_ObjFanin0(pRoot) );
    Vec_PtrPush( p->vVisited, Abc_ObjFanin1(pRoot) );
    pRoot->fMarkB = 1;
    Abc_ObjFanin0(pRoot)->fMarkB = 1;
    Abc_ObjFanin1(pRoot)->fMarkB = 1;

    // start the cut 
    Vec_PtrClear( p->vNodeLeaves );
    Vec_PtrPush( p->vNodeLeaves, Abc_ObjFanin0(pRoot) );
    Vec_PtrPush( p->vNodeLeaves, Abc_ObjFanin1(pRoot) );

    // compute the cut
    while ( Abc_NodeBuildCutLevelOne_int( p->vVisited, p->vNodeLeaves, p->nNodeSizeMax, p->nNodeFanStop ) );
    assert( Vec_PtrSize(p->vNodeLeaves) <= p->nNodeSizeMax );

    // return if containing cut is not requested
    if ( !fContain )
    {
        // unmark both fMarkA and fMarkB in tbe TFI
        Abc_NodesUnmarkB( p->vVisited );
        return p->vNodeLeaves;
    }

//printf( "\n\n\n" );
    // compute the containing cut
    assert( p->nNodeSizeMax < p->nConeSizeMax );
    // copy the current boundary
    Vec_PtrClear( p->vConeLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodeLeaves, pNode, i )
        Vec_PtrPush( p->vConeLeaves, pNode );
    // compute the containing cut
    while ( Abc_NodeBuildCutLevelOne_int( p->vVisited, p->vConeLeaves, p->nConeSizeMax, p->nConeFanStop ) );
    assert( Vec_PtrSize(p->vConeLeaves) <= p->nConeSizeMax );
    // unmark TFI using fMarkA and fMarkB
    Abc_NodesUnmarkB( p->vVisited );
    return p->vNodeLeaves;
}